

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O1

bool __thiscall
cmVariableWatchCommand::InitialPass
          (cmVariableWatchCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  undefined1 *client_data;
  cmake *pcVar4;
  string command;
  ostringstream ostr;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  string local_1b8;
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  __v = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__v == pbVar1) {
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"must be called with at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    bVar2 = false;
  }
  else {
    local_1d0 = 0;
    local_1c8 = 0;
    local_1d8 = &local_1c8;
    if (0x20 < (ulong)((long)pbVar1 - (long)__v)) {
      std::__cxx11::string::_M_assign((string *)&local_1d8);
    }
    iVar3 = std::__cxx11::string::compare((char *)__v);
    if (iVar3 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"cannot be set on the variable: ",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,(__v->_M_dataplus)._M_p,__v->_M_string_length);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      bVar2 = false;
    }
    else {
      client_data = (undefined1 *)operator_new(0x28);
      *(undefined1 **)(client_data + 8) = client_data + 0x18;
      *(undefined8 *)(client_data + 0x10) = 0;
      client_data[0x18] = 0;
      *client_data = 0;
      std::__cxx11::string::_M_assign((string *)(client_data + 8));
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->WatchedVariables,__v);
      pcVar4 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      bVar2 = cmVariableWatch::AddWatch
                        ((pcVar4->VariableWatch)._M_t.
                         super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>
                         .super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl,__v,
                         cmVariableWatchCommandVariableAccessed,client_data,
                         deleteVariableWatchCallbackData);
      if (!bVar2) {
        deleteVariableWatchCallbackData(client_data);
      }
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
    }
  }
  return bVar2;
}

Assistant:

bool cmVariableWatchCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("must be called with at least one argument.");
    return false;
  }
  std::string const& variable = args[0];
  std::string command;
  if (args.size() > 1) {
    command = args[1];
  }
  if (variable == "CMAKE_CURRENT_LIST_FILE") {
    std::ostringstream ostr;
    ostr << "cannot be set on the variable: " << variable;
    this->SetError(ostr.str());
    return false;
  }

  cmVariableWatchCallbackData* data = new cmVariableWatchCallbackData;

  data->InCallback = false;
  data->Command = command;

  this->WatchedVariables.insert(variable);
  if (!this->Makefile->GetCMakeInstance()->GetVariableWatch()->AddWatch(
        variable, cmVariableWatchCommandVariableAccessed, data,
        deleteVariableWatchCallbackData)) {
    deleteVariableWatchCallbackData(data);
    return false;
  }

  return true;
}